

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O0

void __thiscall
TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test::
~TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test
          (TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *this)

{
  TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test *this_local;
  
  ~TEST_MemoryLeakDetectorTest_OneLeakOutsideCheckingPeriod_Test(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, OneLeakOutsideCheckingPeriod)
{
    detector->stopChecking();
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    SimpleString output = detector->report(mem_leak_period_all);
    CHECK(output.contains("Memory leak(s) found"));
    CHECK(output.contains("size: 4"));
    CHECK(output.contains("new"));
    CHECK(output.contains("Total number of leaks"));
    PlatformSpecificFree(mem);
}